

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

void __thiscall gpu::Context::Data::~Data(Data *this)

{
  ostream *this_00;
  long *in_FS_OFFSET;
  Data *this_local;
  
  if (*(Data **)(*in_FS_OFFSET + -8) == this) {
    *(undefined8 *)(*in_FS_OFFSET + -8) = 0;
  }
  else if (*(long *)(*in_FS_OFFSET + -8) != 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "Another GPU context found on context destruction");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr(&this->ocl_engine);
  return;
}

Assistant:

Context::Data::~Data()
{
	if (data_current_ != this) {
		if (data_current_ != 0) {
			std::cerr << "Another GPU context found on context destruction" << std::endl;
		}
	} else {
		data_current_ = 0;
	}

#ifdef CUDA_SUPPORT
	if (cuda_stream) {
		cudaError_t err = cudaStreamDestroy(cuda_stream);
		if (cudaSuccess != err)
			std::cerr << "Warning: cudaStreamDestroy failed: " << cuda::formatError(err) << std::endl;
	}

#ifndef CUDA_USE_PRIMARY_CONTEXT
	if (cuda_context) {
		CUresult err = cuCtxDestroy(cuda_context);
		if (CUDA_SUCCESS != err)
			std::cerr << "Warning: cuCtxDestroy failed: " << cuda::formatDriverError(err) << std::endl;
	}
#endif
#endif
}